

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::
TypedExpectation<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>::
~TypedExpectation(TypedExpectation<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
                  *this)

{
  bool bVar1;
  reference ppvVar2;
  undefined8 *in_RDI;
  const_iterator it;
  ExpectationBase *in_stack_00000210;
  vector<const_void_*,_std::allocator<const_void_*>_> *in_stack_ffffffffffffffc8;
  ExpectationBase *in_stack_ffffffffffffffd0;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_10 [2];
  
  *in_RDI = &PTR__TypedExpectation_00434320;
  ExpectationBase::CheckActionCountIfNotDone(in_stack_00000210);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::begin(in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<void_const*const*,std::vector<void_const*,std::allocator<void_const*>>>::
  __normal_iterator<void_const**>
            ((__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              *)in_stack_ffffffffffffffd0,
             (__normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              *)in_stack_ffffffffffffffc8);
  while( true ) {
    std::vector<const_void_*,_std::allocator<const_void_*>_>::end(in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              ::operator*(local_10);
    in_stack_ffffffffffffffd0 = (ExpectationBase *)*ppvVar2;
    if (in_stack_ffffffffffffffd0 != (ExpectationBase *)0x0) {
      Action<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>::~Action
                ((Action<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)> *)
                 0x2fe436);
      operator_delete(in_stack_ffffffffffffffd0,0x10);
    }
    __gnu_cxx::
    __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
    ::operator++(local_10);
  }
  Action<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>::~Action
            ((Action<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)> *)0x2fe464)
  ;
  Matcher<const_std::tuple<int,_fmt::BasicStringRef<char>,_int,_mp::func::Type>_&>::~Matcher
            ((Matcher<const_std::tuple<int,_fmt::BasicStringRef<char>,_int,_mp::func::Type>_&> *)
             0x2fe475);
  std::
  tuple<testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
  ::~tuple((tuple<testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
            *)0x2fe486);
  ExpectationBase::~ExpectationBase(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }